

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Wrd_t *p_00;
  word *pwVar6;
  int nOns;
  int nOffs;
  Vec_Wrd_t *vFuncs;
  int nWords;
  int nMints;
  int Count;
  int nDCs [32];
  int m;
  int k;
  int i;
  int nOuts_local;
  Vec_Wrd_t *vRel_local;
  Gia_Man_t *p_local;
  
  memset(&nMints,0,0x80);
  nWords = 0;
  iVar1 = 1 << ((byte)nOuts & 0x1f);
  iVar2 = Vec_WrdSize(vRel);
  iVar2 = iVar2 / iVar1;
  p_00 = Vec_WrdStart(nOuts * 2 * iVar2);
  iVar3 = Vec_WrdSize(vRel);
  if (iVar3 % iVar1 != 0) {
    __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x332,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  if (0x20 < nOuts) {
    __assert_fail("nOuts <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x333,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  m = 0;
  do {
    if (iVar2 * 0x40 <= m) {
      if (nWords == 0) {
        printf("The relation was successfully determized with don\'t-cares for %d patterns.\n",
               (ulong)(uint)(iVar2 << 6));
        for (nDCs[0x1f] = 0; nDCs[0x1f] < nOuts; nDCs[0x1f] = nDCs[0x1f] + 1) {
          pwVar6 = Vec_WrdEntryP(p_00,nDCs[0x1f] * 2 * iVar2);
          uVar4 = Abc_TtCountOnesVec(pwVar6,iVar2);
          pwVar6 = Vec_WrdEntryP(p_00,(nDCs[0x1f] * 2 + 1) * iVar2);
          uVar5 = Abc_TtCountOnesVec(pwVar6,iVar2);
          printf("%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n",
                 ((double)(&nMints)[nDCs[0x1f]] * 100.0) / (double)(iVar2 << 6),
                 (ulong)(uint)nDCs[0x1f],(ulong)uVar4,(ulong)uVar5,
                 (ulong)(uint)(&nMints)[nDCs[0x1f]]);
        }
        printf("\n");
      }
      else {
        printf("The relation is not well-defined for %d (out of %d) patterns.\n",(ulong)(uint)nWords
               ,(ulong)(uint)(iVar2 << 6));
      }
      Gia_ManSimRelCheckFuncs(p,vRel,nOuts,p_00);
      return p_00;
    }
    for (nDCs[0x1e] = 0; nDCs[0x1e] < iVar1; nDCs[0x1e] = nDCs[0x1e] + 1) {
      pwVar6 = Vec_WrdArray(vRel);
      iVar3 = Abc_TtGetBit(pwVar6,m * iVar1 + nDCs[0x1e]);
      if (iVar3 != 0) break;
    }
    nWords = (uint)(nDCs[0x1e] == iVar1) + nWords;
    for (nDCs[0x1f] = 0; nDCs[0x1f] < nOuts; nDCs[0x1f] = nDCs[0x1f] + 1) {
      pwVar6 = Vec_WrdArray(vRel);
      iVar3 = Abc_TtGetBit(pwVar6,m * iVar1 + (nDCs[0x1e] ^ 1 << ((byte)nDCs[0x1f] & 0x1f)));
      if (iVar3 == 0) {
        if ((nDCs[0x1e] >> ((byte)nDCs[0x1f] & 0x1f) & 1U) == 0) {
          pwVar6 = Vec_WrdEntryP(p_00,nDCs[0x1f] * 2 * iVar2);
          Abc_TtSetBit(pwVar6,m);
        }
        else {
          pwVar6 = Vec_WrdEntryP(p_00,(nDCs[0x1f] * 2 + 1) * iVar2);
          Abc_TtSetBit(pwVar6,m);
        }
      }
      else {
        (&nMints)[nDCs[0x1f]] = (&nMints)[nDCs[0x1f]] + 1;
      }
    }
    m = m + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, nDCs[32] = {0}, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
        {
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+(m^(1<<k)) ) )
            {
                nDCs[k]++;
                continue;
            }
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
        }
        if ( 0 )
        {
            for ( m = 0; m < nMints; m++ )
                printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            printf( " " );
            for ( k = 0; k < nOuts; k++ )
            {
                if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i ) )
                    printf( "0" );
                else if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i ) )
                    printf( "1" );
                else
                    printf( "-" );
            }
            printf( "\n" );
        }
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
    {
        printf( "The relation was successfully determized with don't-cares for %d patterns.\n", 64 * nWords );
        for ( k = 0; k < nOuts; k++ )
        {
            int nOffs = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), nWords );
            int nOns  = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), nWords );
            printf( "%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n", k, nOffs, nOns, nDCs[k], 100.0*nDCs[k]/(64*nWords) );
        }
        printf( "\n" );
    }
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}